

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscCore.c
# Opt level: O1

void Ssc_ManSetDefaultParams(Ssc_Pars_t *p)

{
  p->nWords = 0;
  p->nBTLimit = 0;
  p->nSatVarMax = 0;
  p->nCallsRecycle = 0;
  p->nCallsRecycle = 0;
  p->fAppend = 0;
  p->fVerbose = 0;
  p->fVerify = 0;
  p->nWords = 1;
  p->nBTLimit = 1000;
  p->nSatVarMax = 5000;
  p->nCallsRecycle = 100;
  p->fVerbose = 0;
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [This procedure sets default parameters.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Ssc_ManSetDefaultParams( Ssc_Pars_t * p )
{
    memset( p, 0, sizeof(Ssc_Pars_t) );
    p->nWords         =     1;  // the number of simulation words
    p->nBTLimit       =  1000;  // conflict limit at a node
    p->nSatVarMax     =  5000;  // the max number of SAT variables
    p->nCallsRecycle  =   100;  // calls to perform before recycling SAT solver
    p->fVerbose       =     0;  // verbose stats
}